

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SizedPtr __thiscall
google::protobuf::internal::SerialArena::
Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
          (SerialArena *this,GetDeallocator deallocator)

{
  ArenaBlock *pAVar1;
  __pointer_type pAVar2;
  SizedPtr SVar3;
  SizedPtr mem;
  GetDeallocator local_18;
  
  local_18.dealloc_ = deallocator.dealloc_;
  FreeStringBlocks(this);
  pAVar2 = (this->head_)._M_b._M_p;
  while( true ) {
    pAVar1 = pAVar2->next;
    if (pAVar1 == (ArenaBlock *)0x0) break;
    mem.n = pAVar2->size;
    mem.p = pAVar2;
    anon_unknown_12::GetDeallocator::operator()(&local_18,mem);
    pAVar2 = pAVar1;
  }
  SVar3.n = pAVar2->size;
  SVar3.p = pAVar2;
  return SVar3;
}

Assistant:

SizedPtr SerialArena::Free(Deallocator deallocator) {
  FreeStringBlocks();

  ArenaBlock* b = head();
  SizedPtr mem = {b, b->size};
  while (b->next) {
    b = b->next;  // We must first advance before deleting this block
    deallocator(mem);
    mem = {b, b->size};
  }
  return mem;
}